

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-utils.h
# Opt level: O3

void dg::llvmutils::printerr(char *msg,Value *val,bool newline)

{
  raw_ostream *this;
  size_t sVar1;
  char *Str;
  StringRef Str_00;
  
  this = (raw_ostream *)llvm::errs();
  if (msg != (char *)0x0) {
    sVar1 = strlen(msg);
    Str_00.Length = sVar1;
    Str_00.Data = msg;
    llvm::raw_ostream::operator<<(this,Str_00);
  }
  if (val[0x10] == (Value)0x0) {
    Str = (char *)llvm::Value::getName();
    llvm::raw_ostream::operator<<(this,Str);
  }
  else {
    llvm::Value::print((raw_ostream *)val,SUB81(this,0));
  }
  if (newline) {
    if (*(undefined1 **)(this + 0x18) == *(undefined1 **)(this + 0x20)) {
      llvm::raw_ostream::write((char *)this,0x11a0f4);
      return;
    }
    **(undefined1 **)(this + 0x20) = 10;
    *(long *)(this + 0x20) = *(long *)(this + 0x20) + 1;
  }
  return;
}

Assistant:

inline void printerr(const char *msg, const Value *val, bool newline = true) {
    print(val, errs(), msg, newline);
}